

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

void __thiscall parse_util::ParseExc::ParseExc(ParseExc *this,string *where,string *par)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  runtime_error *in_RDI;
  stringstream ss;
  string local_1e0 [32];
  runtime_error local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::runtime_error::runtime_error(in_RDI,"");
  *(undefined ***)in_RDI = &PTR__ParseExc_00201d30;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Parse error: in ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," param(s) ");
  poVar1 = std::operator<<(poVar1,local_18);
  std::operator<<(poVar1," is unknown");
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(local_1c0,local_1e0);
  std::runtime_error::operator=(in_RDI,local_1c0);
  std::runtime_error::~runtime_error(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

ParseExc::ParseExc(const string &where, const string &par) :
        std::runtime_error("")
    {
        std::stringstream ss;
        ss << "Parse error: in " << where << " param(s) " << par << " is unknown";
        static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
    }